

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O2

genxStatus genxStartElement(genxElement e)

{
  writerSequence wVar1;
  int iVar2;
  genxWriter w;
  genxStatus gVar3;
  long lVar4;
  
  w = e->writer;
  wVar1 = w->sequence;
  if (wVar1 - SEQUENCE_START_TAG < 2) {
    gVar3 = writeStartTag(w);
    w->status = gVar3;
    if (gVar3 != GENX_SUCCESS) {
      return gVar3;
    }
  }
  else if ((wVar1 == SEQUENCE_POST_DOC) || (wVar1 == SEQUENCE_NO_DOC)) {
    w->status = GENX_SEQUENCE_ERROR;
    return GENX_SEQUENCE_ERROR;
  }
  w->sequence = SEQUENCE_START_TAG;
  iVar2 = (w->attributes).count;
  for (lVar4 = 0; lVar4 < iVar2; lVar4 = lVar4 + 1) {
    *(undefined4 *)((long)(w->attributes).pointers[lVar4] + 0x28) = 0;
  }
  gVar3 = listAppend(&w->stack,e);
  w->status = gVar3;
  if (gVar3 == GENX_SUCCESS) {
    gVar3 = listAppend(&w->stack,(void *)0x0);
    w->status = gVar3;
    if (gVar3 == GENX_SUCCESS) {
      w->nowStarting = e;
      gVar3 = GENX_SUCCESS;
    }
  }
  return gVar3;
}

Assistant:

genxStatus genxStartElement(genxElement e)
{
  genxWriter w = e->writer;
  int i;

  switch (w->sequence)
  {
  case SEQUENCE_NO_DOC:
  case SEQUENCE_POST_DOC:
    return w->status = GENX_SEQUENCE_ERROR;
  case SEQUENCE_START_TAG:
  case SEQUENCE_ATTRIBUTES:
    if ((w->status = writeStartTag(w)) != GENX_SUCCESS)
      return w->status;
    break;
  case SEQUENCE_PRE_DOC:
  case SEQUENCE_CONTENT:
    break;
  }

  w->sequence = SEQUENCE_START_TAG;

  /* clear provided attributes */
  for (i = 0; i < w->attributes.count; i++)
    ((genxAttribute) w->attributes.pointers[i])->provided = 0;

  /*
   * push the stack.  We push a NULL after a pointer to this element
   *  because the stack will also contain pointers to the namespace
   *  attributes that got declared here, so we can keep track of what's
   *  in effect.  I.e. a single stack entry consists logically of a pointer
   *  to an element object, a NULL, then zero or more pairs of pointers to
   *  namespace objects/declarations
   */
  if ((w->status = listAppend(&w->stack, e)) != GENX_SUCCESS)
    return w->status;
  if ((w->status = listAppend(&w->stack, NULL)) != GENX_SUCCESS)
    return w->status;

  w->nowStarting = e;

  return GENX_SUCCESS;
}